

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O1

bool benchmark::ParseInt32(string *src_text,char *str,int32_t *value)

{
  long lVar1;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  char *end;
  char *local_28;
  
  local_28 = (char *)0x0;
  lVar1 = strtol(str,&local_28,10);
  if (*local_28 == '\0') {
    if ((int)lVar1 == lVar1) {
      *value = (int)lVar1;
      return true;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(src_text->_M_dataplus)._M_p,
                        src_text->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," is expected to be a 32-bit integer, ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"but actually has value \"",0x18);
    if (str == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,str,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", ",3);
    pcVar4 = "which overflows.\n";
    lVar1 = 0x11;
  }
  else {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(src_text->_M_dataplus)._M_p,
                        src_text->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," is expected to be a 32-bit integer, ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"but actually has value \"",0x18);
    if (str == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,str,sVar3);
    }
    pcVar4 = "\".\n";
    lVar1 = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar1);
  return false;
}

Assistant:

bool ParseInt32(const std::string& src_text, const char* str, int32_t* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    std::cerr << src_text << " is expected to be a 32-bit integer, "
              << "but actually has value \"" << str << "\".\n";
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const int32_t result = static_cast<int32_t>(long_value);
  if (long_value == std::numeric_limits<long>::max() ||
      long_value == std::numeric_limits<long>::min() ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
          // The parsed value overflows as an Int32.
      ) {
    std::cerr << src_text << " is expected to be a 32-bit integer, "
              << "but actually has value \"" << str << "\", "
              << "which overflows.\n";
    return false;
  }

  *value = result;
  return true;
}